

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O2

void __thiscall
Diligent::DeviceContextVkImpl::BindSparseResourceMemory
          (DeviceContextVkImpl *this,BindSparseResourceMemoryAttribs *Attribs)

{
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_00;
  int iVar1;
  int iVar2;
  SparseTextureMemoryBindInfo *pSVar3;
  SparseBufferMemoryBindInfo *pSVar4;
  SparseBufferMemoryBindRange *pSVar5;
  VkDeviceSize VVar6;
  SparseTextureMemoryBindRange *pSVar7;
  VkSemaphore_T *pVVar8;
  pointer ppVVar9;
  pointer puVar10;
  Uint64 Value;
  bool bVar11;
  pointer pVVar12;
  SoftwareQueueIndex SVar13;
  VkImageAspectFlags VVar14;
  uint uVar15;
  TextureVkImpl *pTVar16;
  SparseTextureProperties *pSVar17;
  BufferVkImpl *this_01;
  VkBuffer pVVar18;
  ulong uVar19;
  TextureFormatAttribs *pTVar20;
  FenceVkImpl *pFVar21;
  ICommandQueueType *Ptr;
  CommandQueueVkImpl *this_02;
  byte bVar22;
  char (*in_RCX) [60];
  ulong uVar23;
  char (*Args_1) [50];
  VkSparseImageMemoryBindInfo *Args_1_00;
  Uint32 UVar24;
  uint uVar25;
  long lVar26;
  uint uVar27;
  size_t j;
  size_type __n;
  int iVar28;
  uint uVar29;
  uint uVar30;
  uint uVar31;
  uint uVar32;
  Uint32 i;
  ulong uVar33;
  ulong uVar34;
  uint uVar35;
  uint uVar36;
  uint uVar37;
  SparseBufferProperties SVar38;
  char (*in_stack_fffffffffffffe38) [2];
  SyncPointVkPtr pSyncPoint;
  string msg_12;
  VkBindSparseInfo BindSparse;
  VkSemaphore WaitSem;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_e0;
  element_type *local_d8;
  vector<VkSparseImageMemoryBindInfo,_std::allocator<VkSparseImageMemoryBindInfo>_> vkImageBinds;
  vector<VkSparseImageOpaqueMemoryBindInfo,_std::allocator<VkSparseImageOpaqueMemoryBindInfo>_>
  vkImageOpaqueBinds;
  vector<VkSparseMemoryBind,_std::allocator<VkSparseMemoryBind>_> vkMemoryBinds;
  vector<VkSparseBufferMemoryBindInfo,_std::allocator<VkSparseBufferMemoryBindInfo>_> vkBufferBinds;
  vector<VkSparseImageMemoryBind,_std::allocator<VkSparseImageMemoryBind>_> vkImageMemoryBinds;
  __shared_ptr<Diligent::SyncPointVk,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  uVar35 = 0;
  DeviceContextBase<Diligent::EngineVkImplTraits>::BindSparseResourceMemory
            ((DeviceContextBase<Diligent::EngineVkImplTraits> *)this,Attribs,0);
  if (Attribs->NumTextureBinds == 0 && Attribs->NumBufferBinds == 0) {
    FormatString<char[26],char[60]>
              ((string *)&BindSparse,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"Attribs.NumBufferBinds != 0 || Attribs.NumTextureBinds != 0",in_RCX);
    DebugAssertionFailed
              ((Char *)BindSparse._0_8_,"BindSparseResourceMemory",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0xfc7);
    std::__cxx11::string::~string((string *)&BindSparse);
  }
  Flush(this);
  for (lVar26 = 0; (ulong)Attribs->NumBufferBinds * 0x18 - lVar26 != 0; lVar26 = lVar26 + 0x18) {
    uVar35 = uVar35 + *(int *)((long)&Attribs->pBufferBinds->NumRanges + lVar26);
  }
  uVar27 = 0;
  uVar37 = 0;
  __n = 0;
  for (uVar23 = 0; uVar23 < Attribs->NumTextureBinds; uVar23 = uVar23 + 1) {
    pSVar3 = Attribs->pTextureBinds;
    pTVar16 = ClassPtrCast<Diligent::TextureVkImpl_const,Diligent::ITexture>
                        (pSVar3[uVar23].pTexture);
    pSVar17 = TextureBase<Diligent::EngineVkImplTraits>::GetSparseProperties
                        (&pTVar16->super_TextureBase<Diligent::EngineVkImplTraits>);
    iVar28 = 0;
    for (lVar26 = 0; (ulong)pSVar3[uVar23].NumRanges << 6 != lVar26; lVar26 = lVar26 + 0x40) {
      if (*(uint *)((long)&(pSVar3[uVar23].pRanges)->MipLevel + lVar26) < pSVar17->FirstMipInTail) {
        iVar28 = iVar28 + 1;
        uVar27 = uVar27 + 1;
      }
      else {
        uVar35 = uVar35 + 1;
        uVar37 = uVar37 + 1;
      }
    }
    __n = (size_type)(((int)__n + 1) - (uint)(iVar28 == 0));
  }
  std::vector<VkSparseBufferMemoryBindInfo,_std::allocator<VkSparseBufferMemoryBindInfo>_>::vector
            (&vkBufferBinds,(ulong)Attribs->NumBufferBinds,(allocator_type *)&BindSparse);
  std::vector<VkSparseImageOpaqueMemoryBindInfo,_std::allocator<VkSparseImageOpaqueMemoryBindInfo>_>
  ::vector(&vkImageOpaqueBinds,(ulong)uVar37,(allocator_type *)&BindSparse);
  std::vector<VkSparseImageMemoryBindInfo,_std::allocator<VkSparseImageMemoryBindInfo>_>::vector
            (&vkImageBinds,__n,(allocator_type *)&BindSparse);
  std::vector<VkSparseMemoryBind,_std::allocator<VkSparseMemoryBind>_>::vector
            (&vkMemoryBinds,(ulong)uVar35,(allocator_type *)&BindSparse);
  std::vector<VkSparseImageMemoryBind,_std::allocator<VkSparseImageMemoryBind>_>::vector
            (&vkImageMemoryBinds,(ulong)uVar27,(allocator_type *)&BindSparse);
  uVar35 = 0;
  for (uVar23 = 0; uVar23 < Attribs->NumBufferBinds; uVar23 = uVar23 + 1) {
    pSVar4 = Attribs->pBufferBinds;
    this_01 = ClassPtrCast<Diligent::BufferVkImpl_const,Diligent::IBuffer>(pSVar4[uVar23].pBuffer);
    SVar38 = BufferVkImpl::GetSparseProperties(this_01);
    pVVar12 = vkBufferBinds.
              super__Vector_base<VkSparseBufferMemoryBindInfo,_std::allocator<VkSparseBufferMemoryBindInfo>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pVVar18 = BufferVkImpl::GetVkBuffer(this_01);
    pVVar12[uVar23].buffer = pVVar18;
    uVar27 = pSVar4[uVar23].NumRanges;
    pVVar12[uVar23].bindCount = uVar27;
    pVVar12[uVar23].pBinds =
         vkMemoryBinds.super__Vector_base<VkSparseMemoryBind,_std::allocator<VkSparseMemoryBind>_>.
         _M_impl.super__Vector_impl_data._M_start + uVar35;
    lVar26 = 0x18;
    for (uVar33 = 0; uVar33 < uVar27; uVar33 = uVar33 + 1) {
      pSVar5 = pSVar4[uVar23].pRanges;
      RefCntAutoPtr<Diligent::IDeviceMemoryVk>::RefCntAutoPtr
                ((RefCntAutoPtr<Diligent::IDeviceMemoryVk> *)&pSyncPoint,
                 *(IObject **)((long)&pSVar5->BufferOffset + lVar26),
                 (INTERFACE_ID *)IID_DeviceMemoryVk);
      if ((pSyncPoint.super___shared_ptr<Diligent::SyncPointVk,_(__gnu_cxx::_Lock_policy)2>._M_ptr
          == (element_type *)0x0) == (*(long *)((long)&pSVar5->BufferOffset + lVar26) != 0)) {
        FormatString<char[70]>
                  ((string *)&BindSparse,
                   (char (*) [70])
                   "Failed to query IDeviceMemoryVk interface from non-null memory object");
        DebugAssertionFailed
                  ((Char *)BindSparse._0_8_,"BindSparseResourceMemory",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                   ,0x1009);
        std::__cxx11::string::~string((string *)&BindSparse);
      }
      if (pSyncPoint.super___shared_ptr<Diligent::SyncPointVk,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
          (element_type *)0x0) {
        msg_12._M_dataplus._M_p = (pointer)0x0;
        msg_12._M_string_length = 0;
        msg_12.field_2._M_allocated_capacity = 0;
      }
      else {
        (**(code **)&((pSyncPoint.
                       super___shared_ptr<Diligent::SyncPointVk,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                     ->super_enable_shared_from_this<Diligent::SyncPointVk>)._M_weak_this.
                     super___weak_ptr<Diligent::SyncPointVk,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1].
                     super_enable_shared_from_this<Diligent::SyncPointVk>._M_weak_this.
                     super___weak_ptr<Diligent::SyncPointVk,_(__gnu_cxx::_Lock_policy)2>)
                  (&msg_12,pSyncPoint.
                           super___shared_ptr<Diligent::SyncPointVk,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr,*(undefined8 *)((long)pSVar5 + lVar26 + -0x10),
                   *(undefined8 *)((long)pSVar5 + lVar26 + -8));
      }
      if (msg_12._M_string_length % (ulong)SVar38.BlockSize != 0) {
        FormatString<char[71]>
                  ((string *)&BindSparse,
                   (char (*) [71])
                   "MemoryOffset must be multiple of the SparseBufferProperties::BlockSize");
        DebugAssertionFailed
                  ((Char *)BindSparse._0_8_,"BindSparseResourceMemory",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                   ,0x100d);
        std::__cxx11::string::~string((string *)&BindSparse);
      }
      uVar19 = uVar35 + uVar33 & 0xffffffff;
      vkMemoryBinds.super__Vector_base<VkSparseMemoryBind,_std::allocator<VkSparseMemoryBind>_>.
      _M_impl.super__Vector_impl_data._M_start[uVar19].resourceOffset =
           *(VkDeviceSize *)((long)pSVar5 + lVar26 + -0x18);
      VVar6 = *(VkDeviceSize *)((long)pSVar5 + lVar26 + -8);
      vkMemoryBinds.super__Vector_base<VkSparseMemoryBind,_std::allocator<VkSparseMemoryBind>_>.
      _M_impl.super__Vector_impl_data._M_start[uVar19].size = VVar6;
      vkMemoryBinds.super__Vector_base<VkSparseMemoryBind,_std::allocator<VkSparseMemoryBind>_>.
      _M_impl.super__Vector_impl_data._M_start[uVar19].memory =
           (VkDeviceMemory)msg_12._M_dataplus._M_p;
      vkMemoryBinds.super__Vector_base<VkSparseMemoryBind,_std::allocator<VkSparseMemoryBind>_>.
      _M_impl.super__Vector_impl_data._M_start[uVar19].memoryOffset = msg_12._M_string_length;
      vkMemoryBinds.super__Vector_base<VkSparseMemoryBind,_std::allocator<VkSparseMemoryBind>_>.
      _M_impl.super__Vector_impl_data._M_start[uVar19].flags = 0;
      if (VVar6 == 0) {
        FormatString<char[36]>
                  ((string *)&BindSparse,(char (*) [36])"Buffer memory size must not be zero");
        DebugAssertionFailed
                  ((Char *)BindSparse._0_8_,"BindSparseResourceMemory",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                   ,0x1016);
        std::__cxx11::string::~string((string *)&BindSparse);
      }
      RefCntAutoPtr<Diligent::IDeviceMemoryVk>::Release
                ((RefCntAutoPtr<Diligent::IDeviceMemoryVk> *)&pSyncPoint);
      uVar27 = pSVar4[uVar23].NumRanges;
      lVar26 = lVar26 + 0x20;
    }
    uVar35 = uVar35 + (int)uVar33;
  }
  uVar23 = 0;
  uVar33 = 0;
  uVar27 = 0;
  uVar37 = 0;
  while( true ) {
    uVar31 = (uint)uVar33;
    uVar19 = (ulong)uVar37;
    if (Attribs->NumTextureBinds <= uVar23) break;
    pSVar3 = Attribs->pTextureBinds;
    pTVar16 = ClassPtrCast<Diligent::TextureVkImpl_const,Diligent::ITexture>
                        (pSVar3[uVar23].pTexture);
    pSVar17 = TextureBase<Diligent::EngineVkImplTraits>::GetSparseProperties
                        (&pTVar16->super_TextureBase<Diligent::EngineVkImplTraits>);
    pTVar20 = GetTextureFormatAttribs
                        ((pTVar16->super_TextureBase<Diligent::EngineVkImplTraits>).
                         super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
                         .m_Desc.Format);
    VVar14 = ComponentTypeToVkAspectMask(pTVar20->ComponentType);
    local_d8 = (element_type *)CONCAT44(local_d8._4_4_,VVar14);
    lVar26 = 0x38;
    uVar36 = 0;
    for (uVar34 = 0; uVar34 < pSVar3[uVar23].NumRanges; uVar34 = uVar34 + 1) {
      pSVar7 = pSVar3[uVar23].pRanges;
      RefCntAutoPtr<Diligent::IDeviceMemoryVk>::RefCntAutoPtr
                ((RefCntAutoPtr<Diligent::IDeviceMemoryVk> *)&pSyncPoint,
                 *(IObject **)((long)&pSVar7->MipLevel + lVar26),(INTERFACE_ID *)IID_DeviceMemoryVk)
      ;
      if ((pSyncPoint.super___shared_ptr<Diligent::SyncPointVk,_(__gnu_cxx::_Lock_policy)2>._M_ptr
          == (element_type *)0x0) == (*(long *)((long)&pSVar7->MipLevel + lVar26) != 0)) {
        FormatString<char[70]>
                  ((string *)&BindSparse,
                   (char (*) [70])
                   "Failed to query IDeviceMemoryVk interface from non-null memory object");
        DebugAssertionFailed
                  ((Char *)BindSparse._0_8_,"BindSparseResourceMemory",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                   ,0x1029);
        std::__cxx11::string::~string((string *)&BindSparse);
      }
      if (pSyncPoint.super___shared_ptr<Diligent::SyncPointVk,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
          (element_type *)0x0) {
        msg_12._M_dataplus._M_p = (pointer)0x0;
        msg_12._M_string_length = 0;
        msg_12.field_2._M_allocated_capacity = 0;
      }
      else {
        (**(code **)&((pSyncPoint.
                       super___shared_ptr<Diligent::SyncPointVk,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                     ->super_enable_shared_from_this<Diligent::SyncPointVk>)._M_weak_this.
                     super___weak_ptr<Diligent::SyncPointVk,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1].
                     super_enable_shared_from_this<Diligent::SyncPointVk>._M_weak_this.
                     super___weak_ptr<Diligent::SyncPointVk,_(__gnu_cxx::_Lock_policy)2>)
                  (&msg_12,pSyncPoint.
                           super___shared_ptr<Diligent::SyncPointVk,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr,*(undefined8 *)((long)pSVar7 + lVar26 + -8),
                   *(undefined8 *)((long)pSVar7 + lVar26 + -0x10));
      }
      if (msg_12._M_string_length % (ulong)pSVar17->BlockSize != 0) {
        FormatString<char[74]>
                  ((string *)&BindSparse,
                   (char (*) [74])
                   "MemoryOffset must be a multiple of the SparseTextureProperties::BlockSize");
        DebugAssertionFailed
                  ((Char *)BindSparse._0_8_,"BindSparseResourceMemory",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                   ,0x102d);
        std::__cxx11::string::~string((string *)&BindSparse);
      }
      uVar30 = *(uint *)((long)pSVar7 + lVar26 + -0x38);
      if (uVar30 < pSVar17->FirstMipInTail) {
        bVar22 = (byte)uVar30;
        uVar29 = (pTVar16->super_TextureBase<Diligent::EngineVkImplTraits>).
                 super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
                 .m_Desc.Width >> (bVar22 & 0x1f);
        uVar15 = (pTVar16->super_TextureBase<Diligent::EngineVkImplTraits>).
                 super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
                 .m_Desc.Height >> (bVar22 & 0x1f);
        UVar24 = 1;
        if ((pTVar16->super_TextureBase<Diligent::EngineVkImplTraits>).
            super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
            .m_Desc.Type == RESOURCE_DIM_TEX_3D) {
          UVar24 = (pTVar16->super_TextureBase<Diligent::EngineVkImplTraits>).
                   super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
                   .m_Desc.field_3.ArraySize;
        }
        uVar25 = UVar24 >> (bVar22 & 0x1f);
        vkImageMemoryBinds.
        super__Vector_base<VkSparseImageMemoryBind,_std::allocator<VkSparseImageMemoryBind>_>.
        _M_impl.super__Vector_impl_data._M_start[uVar33 + uVar36].subresource.arrayLayer =
             *(uint32_t *)((long)pSVar7 + lVar26 + -0x34);
        vkImageMemoryBinds.
        super__Vector_base<VkSparseImageMemoryBind,_std::allocator<VkSparseImageMemoryBind>_>.
        _M_impl.super__Vector_impl_data._M_start[uVar33 + uVar36].subresource.aspectMask =
             (VkImageAspectFlags)local_d8;
        vkImageMemoryBinds.
        super__Vector_base<VkSparseImageMemoryBind,_std::allocator<VkSparseImageMemoryBind>_>.
        _M_impl.super__Vector_impl_data._M_start[uVar33 + uVar36].subresource.mipLevel = uVar30;
        iVar28 = *(int *)((long)pSVar7 + lVar26 + -0x30);
        vkImageMemoryBinds.
        super__Vector_base<VkSparseImageMemoryBind,_std::allocator<VkSparseImageMemoryBind>_>.
        _M_impl.super__Vector_impl_data._M_start[uVar33 + uVar36].offset.x = iVar28;
        iVar1 = *(int *)((long)pSVar7 + lVar26 + -0x28);
        vkImageMemoryBinds.
        super__Vector_base<VkSparseImageMemoryBind,_std::allocator<VkSparseImageMemoryBind>_>.
        _M_impl.super__Vector_impl_data._M_start[uVar33 + uVar36].offset.y = iVar1;
        iVar2 = *(int *)((long)pSVar7 + lVar26 + -0x20);
        vkImageMemoryBinds.
        super__Vector_base<VkSparseImageMemoryBind,_std::allocator<VkSparseImageMemoryBind>_>.
        _M_impl.super__Vector_impl_data._M_start[uVar33 + uVar36].offset.z = iVar2;
        uVar32 = *(int *)((long)pSVar7 + lVar26 + -0x2c) - iVar28;
        uVar30 = (uVar29 + (uVar29 == 0)) - iVar28;
        if (uVar32 <= uVar30) {
          uVar30 = uVar32;
        }
        vkImageMemoryBinds.
        super__Vector_base<VkSparseImageMemoryBind,_std::allocator<VkSparseImageMemoryBind>_>.
        _M_impl.super__Vector_impl_data._M_start[uVar33 + uVar36].extent.width = uVar30;
        uVar29 = *(int *)((long)pSVar7 + lVar26 + -0x24) - iVar1;
        uVar30 = (uVar15 + (uVar15 == 0)) - iVar1;
        if (uVar29 <= uVar30) {
          uVar30 = uVar29;
        }
        vkImageMemoryBinds.
        super__Vector_base<VkSparseImageMemoryBind,_std::allocator<VkSparseImageMemoryBind>_>.
        _M_impl.super__Vector_impl_data._M_start[uVar33 + uVar36].extent.height = uVar30;
        uVar15 = *(int *)((long)pSVar7 + lVar26 + -0x1c) - iVar2;
        uVar30 = (uVar25 + (uVar25 == 0)) - iVar2;
        if (uVar15 <= uVar30) {
          uVar30 = uVar15;
        }
        vkImageMemoryBinds.
        super__Vector_base<VkSparseImageMemoryBind,_std::allocator<VkSparseImageMemoryBind>_>.
        _M_impl.super__Vector_impl_data._M_start[uVar33 + uVar36].extent.depth = uVar30;
        vkImageMemoryBinds.
        super__Vector_base<VkSparseImageMemoryBind,_std::allocator<VkSparseImageMemoryBind>_>.
        _M_impl.super__Vector_impl_data._M_start[uVar33 + uVar36].memory =
             (VkDeviceMemory)msg_12._M_dataplus._M_p;
        vkImageMemoryBinds.
        super__Vector_base<VkSparseImageMemoryBind,_std::allocator<VkSparseImageMemoryBind>_>.
        _M_impl.super__Vector_impl_data._M_start[uVar33 + uVar36].memoryOffset =
             msg_12._M_string_length;
        vkImageMemoryBinds.
        super__Vector_base<VkSparseImageMemoryBind,_std::allocator<VkSparseImageMemoryBind>_>.
        _M_impl.super__Vector_impl_data._M_start[uVar33 + uVar36].flags = 0;
        uVar36 = uVar36 + 1;
      }
      else {
        vkImageOpaqueBinds.
        super__Vector_base<VkSparseImageOpaqueMemoryBindInfo,_std::allocator<VkSparseImageOpaqueMemoryBindInfo>_>
        ._M_impl.super__Vector_impl_data._M_start[uVar27].image =
             (pTVar16->m_VulkanImage).m_VkObject;
        vkImageOpaqueBinds.
        super__Vector_base<VkSparseImageOpaqueMemoryBindInfo,_std::allocator<VkSparseImageOpaqueMemoryBindInfo>_>
        ._M_impl.super__Vector_impl_data._M_start[uVar27].bindCount = 1;
        vkImageOpaqueBinds.
        super__Vector_base<VkSparseImageOpaqueMemoryBindInfo,_std::allocator<VkSparseImageOpaqueMemoryBindInfo>_>
        ._M_impl.super__Vector_impl_data._M_start[uVar27].pBinds =
             vkMemoryBinds.
             super__Vector_base<VkSparseMemoryBind,_std::allocator<VkSparseMemoryBind>_>._M_impl.
             super__Vector_impl_data._M_start + uVar35;
        vkMemoryBinds.super__Vector_base<VkSparseMemoryBind,_std::allocator<VkSparseMemoryBind>_>.
        _M_impl.super__Vector_impl_data._M_start[uVar35].resourceOffset =
             *(long *)((long)pSVar7 + lVar26 + -0x18) + pSVar17->MipTailOffset +
             (ulong)*(uint *)((long)pSVar7 + lVar26 + -0x34) * pSVar17->MipTailStride;
        VVar6 = *(VkDeviceSize *)((long)pSVar7 + lVar26 + -0x10);
        vkMemoryBinds.super__Vector_base<VkSparseMemoryBind,_std::allocator<VkSparseMemoryBind>_>.
        _M_impl.super__Vector_impl_data._M_start[uVar35].size = VVar6;
        vkMemoryBinds.super__Vector_base<VkSparseMemoryBind,_std::allocator<VkSparseMemoryBind>_>.
        _M_impl.super__Vector_impl_data._M_start[uVar35].memory =
             (VkDeviceMemory)msg_12._M_dataplus._M_p;
        vkMemoryBinds.super__Vector_base<VkSparseMemoryBind,_std::allocator<VkSparseMemoryBind>_>.
        _M_impl.super__Vector_impl_data._M_start[uVar35].memoryOffset = msg_12._M_string_length;
        vkMemoryBinds.super__Vector_base<VkSparseMemoryBind,_std::allocator<VkSparseMemoryBind>_>.
        _M_impl.super__Vector_impl_data._M_start[uVar35].flags = 0;
        if (VVar6 == 0) {
          FormatString<char[46]>
                    ((string *)&BindSparse,
                     (char (*) [46])"Texture mip tail memory size must not be zero");
          DebugAssertionFailed
                    ((Char *)BindSparse._0_8_,"BindSparseResourceMemory",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                     ,0x1054);
          std::__cxx11::string::~string((string *)&BindSparse);
        }
        uVar27 = uVar27 + 1;
        uVar35 = uVar35 + 1;
        uVar30 = (uint)(pTVar16->super_TextureBase<Diligent::EngineVkImplTraits>).
                       super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
                       .m_Desc.Type;
        if ((((uVar30 < 9) && ((0x1a8U >> (uVar30 & 0x1f) & 1) != 0)) &&
            ((pSVar17->Flags & SPARSE_TEXTURE_FLAG_SINGLE_MIPTAIL) == SPARSE_TEXTURE_FLAG_NONE)) &&
           (pSVar17->MipTailStride == 0)) {
          FormatString<char[110]>
                    ((string *)&BindSparse,
                     (char (*) [110])
                     "For texture arrays, if SPARSE_TEXTURE_FLAG_SINGLE_MIPTAIL flag is not present, MipTailStride must not be zero"
                    );
          DebugAssertionFailed
                    ((Char *)BindSparse._0_8_,"BindSparseResourceMemory",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                     ,0x1056);
          std::__cxx11::string::~string((string *)&BindSparse);
        }
      }
      RefCntAutoPtr<Diligent::IDeviceMemoryVk>::Release
                ((RefCntAutoPtr<Diligent::IDeviceMemoryVk> *)&pSyncPoint);
      lVar26 = lVar26 + 0x40;
    }
    if (uVar36 != 0) {
      uVar37 = uVar37 + 1;
      vkImageBinds.
      super__Vector_base<VkSparseImageMemoryBindInfo,_std::allocator<VkSparseImageMemoryBindInfo>_>.
      _M_impl.super__Vector_impl_data._M_start[uVar19].image = (pTVar16->m_VulkanImage).m_VkObject;
      vkImageBinds.
      super__Vector_base<VkSparseImageMemoryBindInfo,_std::allocator<VkSparseImageMemoryBindInfo>_>.
      _M_impl.super__Vector_impl_data._M_start[uVar19].bindCount = uVar36;
      vkImageBinds.
      super__Vector_base<VkSparseImageMemoryBindInfo,_std::allocator<VkSparseImageMemoryBindInfo>_>.
      _M_impl.super__Vector_impl_data._M_start[uVar19].pBinds =
           vkImageMemoryBinds.
           super__Vector_base<VkSparseImageMemoryBind,_std::allocator<VkSparseImageMemoryBind>_>.
           _M_impl.super__Vector_impl_data._M_start + uVar33;
      uVar31 = uVar31 + uVar36;
    }
    uVar33 = (ulong)uVar31;
    uVar23 = uVar23 + 1;
  }
  Args_1 = (char (*) [50])(ulong)uVar35;
  if ((char (*) [50])
      (((long)vkMemoryBinds.
              super__Vector_base<VkSparseMemoryBind,_std::allocator<VkSparseMemoryBind>_>._M_impl.
              super__Vector_impl_data._M_finish -
       (long)vkMemoryBinds.
             super__Vector_base<VkSparseMemoryBind,_std::allocator<VkSparseMemoryBind>_>._M_impl.
             super__Vector_impl_data._M_start) / 0x28) != Args_1) {
    FormatString<char[26],char[40]>
              ((string *)&BindSparse,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"MemoryBindCount == vkMemoryBinds.size()",(char (*) [40])Args_1);
    Args_1 = (char (*) [50])0x1065;
    DebugAssertionFailed
              ((Char *)BindSparse._0_8_,"BindSparseResourceMemory",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0x1065);
    std::__cxx11::string::~string((string *)&BindSparse);
  }
  if ((long)vkImageMemoryBinds.
            super__Vector_base<VkSparseImageMemoryBind,_std::allocator<VkSparseImageMemoryBind>_>.
            _M_impl.super__Vector_impl_data._M_finish -
      (long)vkImageMemoryBinds.
            super__Vector_base<VkSparseImageMemoryBind,_std::allocator<VkSparseImageMemoryBind>_>.
            _M_impl.super__Vector_impl_data._M_start >> 6 != uVar33) {
    FormatString<char[26],char[50]>
              ((string *)&BindSparse,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"ImageMemoryBindCount == vkImageMemoryBinds.size()",Args_1);
    Args_1 = (char (*) [50])0x1066;
    DebugAssertionFailed
              ((Char *)BindSparse._0_8_,"BindSparseResourceMemory",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0x1066);
    std::__cxx11::string::~string((string *)&BindSparse);
  }
  if (((long)vkImageBinds.
             super__Vector_base<VkSparseImageMemoryBindInfo,_std::allocator<VkSparseImageMemoryBindInfo>_>
             ._M_impl.super__Vector_impl_data._M_finish -
      (long)vkImageBinds.
            super__Vector_base<VkSparseImageMemoryBindInfo,_std::allocator<VkSparseImageMemoryBindInfo>_>
            ._M_impl.super__Vector_impl_data._M_start) / 0x18 != uVar19) {
    FormatString<char[26],char[38]>
              ((string *)&BindSparse,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"ImageBindCount == vkImageBinds.size()",(char (*) [38])Args_1);
    DebugAssertionFailed
              ((Char *)BindSparse._0_8_,"BindSparseResourceMemory",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0x1067);
    std::__cxx11::string::~string((string *)&BindSparse);
  }
  if ((char (*) [47])
      (((long)vkImageOpaqueBinds.
              super__Vector_base<VkSparseImageOpaqueMemoryBindInfo,_std::allocator<VkSparseImageOpaqueMemoryBindInfo>_>
              ._M_impl.super__Vector_impl_data._M_finish -
       (long)vkImageOpaqueBinds.
             super__Vector_base<VkSparseImageOpaqueMemoryBindInfo,_std::allocator<VkSparseImageOpaqueMemoryBindInfo>_>
             ._M_impl.super__Vector_impl_data._M_start) / 0x18) != (char (*) [47])(ulong)uVar27) {
    FormatString<char[26],char[47]>
              ((string *)&BindSparse,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"ImageOpqBindCount == vkImageOpaqueBinds.size()",
               (char (*) [47])(ulong)uVar27);
    DebugAssertionFailed
              ((Char *)BindSparse._0_8_,"BindSparseResourceMemory",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0x1068);
    std::__cxx11::string::~string((string *)&BindSparse);
  }
  BindSparse.pNext = (void *)0x0;
  BindSparse.signalSemaphoreCount = 0;
  BindSparse._84_4_ = 0;
  BindSparse.pSignalSemaphores = (VkSemaphore *)0x0;
  BindSparse.imageBindCount = 0;
  BindSparse._68_4_ = 0;
  BindSparse.pImageBinds = (VkSparseImageMemoryBindInfo *)0x0;
  BindSparse.imageOpaqueBindCount = 0;
  BindSparse._52_4_ = 0;
  BindSparse.pImageOpaqueBinds = (VkSparseImageOpaqueMemoryBindInfo *)0x0;
  BindSparse.bufferBindCount = 0;
  BindSparse._36_4_ = 0;
  BindSparse.pBufferBinds = (VkSparseBufferMemoryBindInfo *)0x0;
  BindSparse.waitSemaphoreCount = 0;
  BindSparse._20_4_ = 0;
  BindSparse.pWaitSemaphores = (VkSemaphore *)0x0;
  BindSparse.sType = VK_STRUCTURE_TYPE_BIND_SPARSE_INFO;
  BindSparse._4_4_ = 0;
  msg_12._M_dataplus._M_p =
       (pointer)(((long)vkBufferBinds.
                        super__Vector_base<VkSparseBufferMemoryBindInfo,_std::allocator<VkSparseBufferMemoryBindInfo>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)vkBufferBinds.
                       super__Vector_base<VkSparseBufferMemoryBindInfo,_std::allocator<VkSparseBufferMemoryBindInfo>_>
                       ._M_impl.super__Vector_impl_data._M_start) / 0x18);
  uVar35 = StaticCast<unsigned_int,unsigned_long>((unsigned_long *)&msg_12);
  BindSparse.bufferBindCount = uVar35;
  BindSparse.pBufferBinds = (VkSparseBufferMemoryBindInfo *)0x0;
  if (vkBufferBinds.
      super__Vector_base<VkSparseBufferMemoryBindInfo,_std::allocator<VkSparseBufferMemoryBindInfo>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      vkBufferBinds.
      super__Vector_base<VkSparseBufferMemoryBindInfo,_std::allocator<VkSparseBufferMemoryBindInfo>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    BindSparse.pBufferBinds =
         vkBufferBinds.
         super__Vector_base<VkSparseBufferMemoryBindInfo,_std::allocator<VkSparseBufferMemoryBindInfo>_>
         ._M_impl.super__Vector_impl_data._M_start;
  }
  msg_12._M_dataplus._M_p =
       (pointer)(((long)vkImageOpaqueBinds.
                        super__Vector_base<VkSparseImageOpaqueMemoryBindInfo,_std::allocator<VkSparseImageOpaqueMemoryBindInfo>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)vkImageOpaqueBinds.
                       super__Vector_base<VkSparseImageOpaqueMemoryBindInfo,_std::allocator<VkSparseImageOpaqueMemoryBindInfo>_>
                       ._M_impl.super__Vector_impl_data._M_start) / 0x18);
  uVar35 = StaticCast<unsigned_int,unsigned_long>((unsigned_long *)&msg_12);
  BindSparse.imageOpaqueBindCount = uVar35;
  BindSparse.pImageOpaqueBinds = (VkSparseImageOpaqueMemoryBindInfo *)0x0;
  if (vkImageOpaqueBinds.
      super__Vector_base<VkSparseImageOpaqueMemoryBindInfo,_std::allocator<VkSparseImageOpaqueMemoryBindInfo>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      vkImageOpaqueBinds.
      super__Vector_base<VkSparseImageOpaqueMemoryBindInfo,_std::allocator<VkSparseImageOpaqueMemoryBindInfo>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    BindSparse.pImageOpaqueBinds =
         vkImageOpaqueBinds.
         super__Vector_base<VkSparseImageOpaqueMemoryBindInfo,_std::allocator<VkSparseImageOpaqueMemoryBindInfo>_>
         ._M_impl.super__Vector_impl_data._M_start;
  }
  msg_12._M_dataplus._M_p =
       (pointer)(((long)vkImageBinds.
                        super__Vector_base<VkSparseImageMemoryBindInfo,_std::allocator<VkSparseImageMemoryBindInfo>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)vkImageBinds.
                       super__Vector_base<VkSparseImageMemoryBindInfo,_std::allocator<VkSparseImageMemoryBindInfo>_>
                       ._M_impl.super__Vector_impl_data._M_start) / 0x18);
  uVar35 = StaticCast<unsigned_int,unsigned_long>((unsigned_long *)&msg_12);
  BindSparse.imageBindCount = uVar35;
  Args_1_00 = (VkSparseImageMemoryBindInfo *)0x0;
  if (vkImageBinds.
      super__Vector_base<VkSparseImageMemoryBindInfo,_std::allocator<VkSparseImageMemoryBindInfo>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      vkImageBinds.
      super__Vector_base<VkSparseImageMemoryBindInfo,_std::allocator<VkSparseImageMemoryBindInfo>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    Args_1_00 = vkImageBinds.
                super__Vector_base<VkSparseImageMemoryBindInfo,_std::allocator<VkSparseImageMemoryBindInfo>_>
                ._M_impl.super__Vector_impl_data._M_start;
  }
  BindSparse.pImageBinds = Args_1_00;
  if (((this->m_VkSignalSemaphores).
       super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
       super__Vector_impl_data._M_start !=
       (this->m_VkSignalSemaphores).
       super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
       super__Vector_impl_data._M_finish) ||
     ((this->m_SignalSemaphoreValues).
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (this->m_SignalSemaphoreValues).
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish)) {
    FormatString<char[26],char[64]>
              (&msg_12,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_VkSignalSemaphores.empty() && m_SignalSemaphoreValues.empty()",
               (char (*) [64])Args_1_00);
    Args_1_00 = (VkSparseImageMemoryBindInfo *)0x1073;
    DebugAssertionFailed
              (msg_12._M_dataplus._M_p,"BindSparseResourceMemory",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0x1073);
    std::__cxx11::string::~string((string *)&msg_12);
  }
  if (((this->m_VkWaitSemaphores).
       super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
       super__Vector_impl_data._M_start !=
       (this->m_VkWaitSemaphores).
       super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
       super__Vector_impl_data._M_finish) ||
     ((this->m_WaitSemaphoreValues).
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (this->m_WaitSemaphoreValues).
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish)) {
    FormatString<char[26],char[60]>
              (&msg_12,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_VkWaitSemaphores.empty() && m_WaitSemaphoreValues.empty()",
               (char (*) [60])Args_1_00);
    DebugAssertionFailed
              (msg_12._M_dataplus._M_p,"BindSparseResourceMemory",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0x1074);
    std::__cxx11::string::~string((string *)&msg_12);
  }
  bVar11 = false;
  for (uVar23 = 0; uVar23 < Attribs->NumSignalFences; uVar23 = uVar23 + 1) {
    pFVar21 = ClassPtrCast<Diligent::FenceVkImpl,Diligent::IFence>(Attribs->ppSignalFences[uVar23]);
    msg_12._M_dataplus._M_p = (pointer)Attribs->pSignalFenceValues[uVar23];
    if ((pFVar21->m_TimelineSemaphore).m_VkObject != (VkSemaphore_T *)0x0) {
      FenceBase<Diligent::EngineVkImplTraits>::DvpSignal
                (&pFVar21->super_FenceBase<Diligent::EngineVkImplTraits>,
                 (Uint64)msg_12._M_dataplus._M_p);
      pSyncPoint.super___shared_ptr<Diligent::SyncPointVk,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)(pFVar21->m_TimelineSemaphore).m_VkObject;
      std::vector<VkSemaphore_T*,std::allocator<VkSemaphore_T*>>::emplace_back<VkSemaphore_T*>
                ((vector<VkSemaphore_T*,std::allocator<VkSemaphore_T*>> *)
                 &this->m_VkSignalSemaphores,(VkSemaphore_T **)&pSyncPoint);
      bVar11 = true;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                (&this->m_SignalSemaphoreValues,(value_type_conflict2 *)&msg_12);
    }
  }
  this_00 = &this->m_WaitSemaphoreValues;
  local_d8 = (element_type *)&this->m_WaitRecycledSemaphores;
  for (uVar23 = 0; uVar23 < Attribs->NumWaitFences; uVar23 = uVar23 + 1) {
    pFVar21 = ClassPtrCast<Diligent::FenceVkImpl,Diligent::IFence>(Attribs->ppWaitFences[uVar23]);
    pSyncPoint.super___shared_ptr<Diligent::SyncPointVk,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)Attribs->pWaitFenceValues[uVar23];
    FenceBase<Diligent::EngineVkImplTraits>::DvpDeviceWait
              (&pFVar21->super_FenceBase<Diligent::EngineVkImplTraits>,
               (Uint64)pSyncPoint.
                       super___shared_ptr<Diligent::SyncPointVk,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
    ;
    pVVar8 = (pFVar21->m_TimelineSemaphore).m_VkObject;
    if (pVVar8 == (VkSemaphore_T *)0x0) {
      SVar13 = DeviceContextNextGenBase<Diligent::EngineVkImplTraits>::GetCommandQueueId
                         (&this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>);
      FenceVkImpl::ExtractSignalSemaphore
                ((VulkanRecycledSemaphore *)&msg_12,pFVar21,SVar13,
                 (Uint64)pSyncPoint.
                         super___shared_ptr<Diligent::SyncPointVk,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr);
      if (msg_12.field_2._M_allocated_capacity != 0) {
        WaitSem = (VkSemaphore)msg_12.field_2._M_allocated_capacity;
        std::vector<VkSemaphore_T*,std::allocator<VkSemaphore_T*>>::emplace_back<VkSemaphore_T*>
                  ((vector<VkSemaphore_T*,std::allocator<VkSemaphore_T*>> *)
                   &this->m_VkWaitSemaphores,&WaitSem);
        WaitSem = (VkSemaphore)CONCAT44(WaitSem._4_4_,0x10000);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                  (&this->m_WaitDstStageMasks,(uint *)&WaitSem);
        std::
        vector<VulkanUtilities::VulkanSyncObjectManager::RecycledSyncObject<VulkanUtilities::VkSemaphoreType>,std::allocator<VulkanUtilities::VulkanSyncObjectManager::RecycledSyncObject<VulkanUtilities::VkSemaphoreType>>>
        ::
        emplace_back<VulkanUtilities::VulkanSyncObjectManager::RecycledSyncObject<VulkanUtilities::VkSemaphoreType>>
                  ((vector<VulkanUtilities::VulkanSyncObjectManager::RecycledSyncObject<VulkanUtilities::VkSemaphoreType>,std::allocator<VulkanUtilities::VulkanSyncObjectManager::RecycledSyncObject<VulkanUtilities::VkSemaphoreType>>>
                    *)local_d8,(RecycledSyncObject<VulkanUtilities::VkSemaphoreType> *)&msg_12);
        WaitSem = (VkSemaphore)0x0;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
                  (this_00,(unsigned_long *)&WaitSem);
      }
      VulkanUtilities::VulkanSyncObjectManager::RecycledSyncObject<VulkanUtilities::VkSemaphoreType>
      ::~RecycledSyncObject((RecycledSyncObject<VulkanUtilities::VkSemaphoreType> *)&msg_12);
    }
    else {
      lVar26 = 0;
      WaitSem = pVVar8;
      for (uVar33 = 0;
          ppVVar9 = (this->m_VkWaitSemaphores).
                    super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
          uVar33 < (ulong)((long)(this->m_VkWaitSemaphores).
                                 super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)ppVVar9 >> 3);
          uVar33 = uVar33 + 1) {
        if (*(VkSemaphore *)((long)ppVVar9 + lVar26) == WaitSem) {
          FormatString<char[8],char_const*,char[15],unsigned_long,char[54],unsigned_long,char[2]>
                    (&msg_12,(Diligent *)0x70a495,
                     (char (*) [8])
                     &(pFVar21->super_FenceBase<Diligent::EngineVkImplTraits>).
                      super_DeviceObjectBase<Diligent::IFenceVk,_Diligent::RenderDeviceVkImpl,_Diligent::FenceDesc>
                      .m_Desc,(char **)"\' with value (",(char (*) [15])&pSyncPoint,
                     (unsigned_long *)") is already added to the wait operation with value (",
                     (char (*) [54])
                     ((long)(this_00->
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                            _M_impl.super__Vector_impl_data._M_start + lVar26),
                     (unsigned_long *)0x801c00,in_stack_fffffffffffffe38);
          if (DebugMessageCallback != (undefined *)0x0) {
            (*(code *)DebugMessageCallback)(2,msg_12._M_dataplus._M_p,0,0,0);
          }
          std::__cxx11::string::~string((string *)&msg_12);
        }
        lVar26 = lVar26 + 8;
      }
      std::vector<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>::push_back
                (&this->m_VkWaitSemaphores,&WaitSem);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                (this_00,(value_type_conflict2 *)&pSyncPoint);
      bVar11 = true;
    }
  }
  msg_12._M_dataplus._M_p =
       (pointer)((long)(this->m_VkWaitSemaphores).
                       super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl
                       .super__Vector_impl_data._M_finish -
                 (long)(this->m_VkWaitSemaphores).
                       super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl
                       .super__Vector_impl_data._M_start >> 3);
  uVar35 = StaticCast<unsigned_int,unsigned_long>((unsigned_long *)&msg_12);
  BindSparse.waitSemaphoreCount = uVar35;
  if (uVar35 == 0) {
    BindSparse.pWaitSemaphores = (pointer)0x0;
  }
  else {
    BindSparse.pWaitSemaphores =
         (this->m_VkWaitSemaphores).
         super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
         super__Vector_impl_data._M_start;
  }
  msg_12._M_dataplus._M_p =
       (pointer)((long)(this->m_VkSignalSemaphores).
                       super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl
                       .super__Vector_impl_data._M_finish -
                 (long)(this->m_VkSignalSemaphores).
                       super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl
                       .super__Vector_impl_data._M_start >> 3);
  uVar35 = StaticCast<unsigned_int,unsigned_long>((unsigned_long *)&msg_12);
  BindSparse.signalSemaphoreCount = uVar35;
  if (uVar35 == 0) {
    BindSparse.pSignalSemaphores = (pointer)0x0;
  }
  else {
    BindSparse.pSignalSemaphores =
         (this->m_VkSignalSemaphores).
         super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
         super__Vector_impl_data._M_start;
  }
  msg_12.field_2._M_allocated_capacity = 0;
  msg_12.field_2._8_8_ = 0;
  msg_12._M_dataplus._M_p = (pointer)0x0;
  msg_12._M_string_length = 0;
  if (bVar11) {
    msg_12._M_dataplus._M_p = (pointer)0x3b9df29b;
    msg_12.field_2._M_allocated_capacity = BindSparse._16_8_ & 0xffffffff;
    msg_12.field_2._8_8_ = (pointer)0x0;
    BindSparse.pNext = &msg_12;
    if (BindSparse.waitSemaphoreCount != 0) {
      msg_12.field_2._8_8_ =
           (this_00->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
    }
  }
  pSyncPoint.super___shared_ptr<Diligent::SyncPointVk,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  pSyncPoint.super___shared_ptr<Diligent::SyncPointVk,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  Ptr = DeviceContextNextGenBase<Diligent::EngineVkImplTraits>::LockCommandQueue
                  (&this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>);
  this_02 = ClassPtrCast<Diligent::CommandQueueVkImpl,Diligent::ICommandQueueVk>(Ptr);
  CommandQueueVkImpl::BindSparse(this_02,&BindSparse);
  CommandQueueVkImpl::GetLastSyncPoint((CommandQueueVkImpl *)&WaitSem);
  std::__shared_ptr<Diligent::SyncPointVk,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&pSyncPoint.super___shared_ptr<Diligent::SyncPointVk,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<Diligent::SyncPointVk,_(__gnu_cxx::_Lock_policy)2> *)&WaitSem);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_e0);
  DeviceContextNextGenBase<Diligent::EngineVkImplTraits>::UnlockCommandQueue
            (&this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>);
  if (!bVar11) {
    for (uVar23 = 0; uVar23 < Attribs->NumSignalFences; uVar23 = uVar23 + 1) {
      pFVar21 = ClassPtrCast<Diligent::FenceVkImpl,Diligent::IFence>
                          (Attribs->ppSignalFences[uVar23]);
      if ((pFVar21->m_TimelineSemaphore).m_VkObject == (VkSemaphore_T *)0x0) {
        SVar13 = DeviceContextNextGenBase<Diligent::EngineVkImplTraits>::GetCommandQueueId
                           (&this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>);
        Value = Attribs->pSignalFenceValues[uVar23];
        std::__shared_ptr<Diligent::SyncPointVk,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_40,
                   &pSyncPoint.super___shared_ptr<Diligent::SyncPointVk,_(__gnu_cxx::_Lock_policy)2>
                  );
        FenceVkImpl::AddPendingSyncPoint(pFVar21,SVar13,Value,(SyncPointVkPtr *)&local_40);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
      }
    }
  }
  ppVVar9 = (this->m_VkSignalSemaphores).
            super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->m_VkSignalSemaphores).
      super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppVVar9) {
    (this->m_VkSignalSemaphores).
    super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppVVar9;
  }
  puVar10 = (this->m_SignalSemaphoreValues).
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->m_SignalSemaphoreValues).
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar10) {
    (this->m_SignalSemaphoreValues).
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar10;
  }
  ppVVar9 = (this->m_VkWaitSemaphores).
            super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->m_VkWaitSemaphores).
      super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppVVar9) {
    (this->m_VkWaitSemaphores).super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppVVar9;
  }
  puVar10 = (this->m_WaitSemaphoreValues).
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->m_WaitSemaphoreValues).
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar10) {
    (this->m_WaitSemaphoreValues).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
    _M_impl.super__Vector_impl_data._M_finish = puVar10;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&pSyncPoint.super___shared_ptr<Diligent::SyncPointVk,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::_Vector_base<VkSparseImageMemoryBind,_std::allocator<VkSparseImageMemoryBind>_>::
  ~_Vector_base(&vkImageMemoryBinds.
                 super__Vector_base<VkSparseImageMemoryBind,_std::allocator<VkSparseImageMemoryBind>_>
               );
  std::_Vector_base<VkSparseMemoryBind,_std::allocator<VkSparseMemoryBind>_>::~_Vector_base
            (&vkMemoryBinds.
              super__Vector_base<VkSparseMemoryBind,_std::allocator<VkSparseMemoryBind>_>);
  std::_Vector_base<VkSparseImageMemoryBindInfo,_std::allocator<VkSparseImageMemoryBindInfo>_>::
  ~_Vector_base(&vkImageBinds.
                 super__Vector_base<VkSparseImageMemoryBindInfo,_std::allocator<VkSparseImageMemoryBindInfo>_>
               );
  std::
  _Vector_base<VkSparseImageOpaqueMemoryBindInfo,_std::allocator<VkSparseImageOpaqueMemoryBindInfo>_>
  ::~_Vector_base(&vkImageOpaqueBinds.
                   super__Vector_base<VkSparseImageOpaqueMemoryBindInfo,_std::allocator<VkSparseImageOpaqueMemoryBindInfo>_>
                 );
  std::_Vector_base<VkSparseBufferMemoryBindInfo,_std::allocator<VkSparseBufferMemoryBindInfo>_>::
  ~_Vector_base(&vkBufferBinds.
                 super__Vector_base<VkSparseBufferMemoryBindInfo,_std::allocator<VkSparseBufferMemoryBindInfo>_>
               );
  return;
}

Assistant:

void DeviceContextVkImpl::BindSparseResourceMemory(const BindSparseResourceMemoryAttribs& Attribs)
{
    TDeviceContextBase::BindSparseResourceMemory(Attribs, 0);

    VERIFY_EXPR(Attribs.NumBufferBinds != 0 || Attribs.NumTextureBinds != 0);

    Flush();

    // Calculate the required array sizes
    Uint32 ImageBindCount       = 0;
    Uint32 ImageOpqBindCount    = 0;
    Uint32 MemoryBindCount      = 0;
    Uint32 ImageMemoryBindCount = 0;

    for (Uint32 i = 0; i < Attribs.NumBufferBinds; ++i)
        MemoryBindCount += Attribs.pBufferBinds[i].NumRanges;

    for (Uint32 i = 0; i < Attribs.NumTextureBinds; ++i)
    {
        const SparseTextureMemoryBindInfo& Bind           = Attribs.pTextureBinds[i];
        const TextureVkImpl*               pTexVk         = ClassPtrCast<const TextureVkImpl>(Bind.pTexture);
        const SparseTextureProperties&     TexSparseProps = pTexVk->GetSparseProperties();

        Uint32 NumImageBindsInRange = 0;
        for (Uint32 j = 0; j < Bind.NumRanges; ++j)
        {
            if (Bind.pRanges[j].MipLevel >= TexSparseProps.FirstMipInTail)
            {
                ++MemoryBindCount;
                ++ImageOpqBindCount;
            }
            else
            {
                ++NumImageBindsInRange;
                ++ImageMemoryBindCount;
            }
        }
        if (NumImageBindsInRange > 0)
            ++ImageBindCount;
    }

    std::vector<VkSparseBufferMemoryBindInfo>      vkBufferBinds{Attribs.NumBufferBinds};
    std::vector<VkSparseImageOpaqueMemoryBindInfo> vkImageOpaqueBinds{ImageOpqBindCount};
    std::vector<VkSparseImageMemoryBindInfo>       vkImageBinds{ImageBindCount};
    std::vector<VkSparseMemoryBind>                vkMemoryBinds{MemoryBindCount};
    std::vector<VkSparseImageMemoryBind>           vkImageMemoryBinds{ImageMemoryBindCount};

    MemoryBindCount      = 0;
    ImageMemoryBindCount = 0;
    ImageBindCount       = 0;
    ImageOpqBindCount    = 0;

    for (Uint32 i = 0; i < Attribs.NumBufferBinds; ++i)
    {
        const SparseBufferMemoryBindInfo& BuffBind = Attribs.pBufferBinds[i];
        const BufferVkImpl*               pBuffVk  = ClassPtrCast<const BufferVkImpl>(BuffBind.pBuffer);
#ifdef DILIGENT_DEVELOPMENT
        const SparseBufferProperties& BuffSparseProps = pBuffVk->GetSparseProperties();
#endif

        VkSparseBufferMemoryBindInfo& vkBuffBind{vkBufferBinds[i]};
        vkBuffBind.buffer    = pBuffVk->GetVkBuffer();
        vkBuffBind.bindCount = BuffBind.NumRanges;
        vkBuffBind.pBinds    = &vkMemoryBinds[MemoryBindCount];

        for (Uint32 r = 0; r < BuffBind.NumRanges; ++r)
        {
            const SparseBufferMemoryBindRange& SrcRange = BuffBind.pRanges[r];
            RefCntAutoPtr<IDeviceMemoryVk>     pMemVk{SrcRange.pMemory, IID_DeviceMemoryVk};
            DEV_CHECK_ERR((SrcRange.pMemory != nullptr) == (pMemVk != nullptr),
                          "Failed to query IDeviceMemoryVk interface from non-null memory object");

            const DeviceMemoryRangeVk MemRangeVk = pMemVk ? pMemVk->GetRange(SrcRange.MemoryOffset, SrcRange.MemorySize) : DeviceMemoryRangeVk{};
            DEV_CHECK_ERR(MemRangeVk.Offset % BuffSparseProps.BlockSize == 0,
                          "MemoryOffset must be multiple of the SparseBufferProperties::BlockSize");

            VkSparseMemoryBind& vkMemBind{vkMemoryBinds[MemoryBindCount++]};
            vkMemBind.resourceOffset = SrcRange.BufferOffset;
            vkMemBind.size           = SrcRange.MemorySize; // MemRangeVk.Size may be zero when range is unbound
            vkMemBind.memory         = MemRangeVk.Handle;
            vkMemBind.memoryOffset   = MemRangeVk.Offset;
            vkMemBind.flags          = 0;

            VERIFY(vkMemBind.size > 0, "Buffer memory size must not be zero");
        }
    }

    for (Uint32 i = 0; i < Attribs.NumTextureBinds; ++i)
    {
        const SparseTextureMemoryBindInfo& TexBind        = Attribs.pTextureBinds[i];
        const TextureVkImpl*               pTexVk         = ClassPtrCast<const TextureVkImpl>(TexBind.pTexture);
        const TextureDesc&                 TexDesc        = pTexVk->GetDesc();
        const SparseTextureProperties&     TexSparseProps = pTexVk->GetSparseProperties();
        const TextureFormatAttribs&        FmtAttribs     = GetTextureFormatAttribs(TexDesc.Format);
        const VkImageAspectFlags           aspectMask     = ComponentTypeToVkAspectMask(FmtAttribs.ComponentType);

        Uint32 NumImageBindsInRange = 0;
        for (Uint32 r = 0; r < TexBind.NumRanges; ++r)
        {
            const SparseTextureMemoryBindRange& SrcRange = TexBind.pRanges[r];
            RefCntAutoPtr<IDeviceMemoryVk>      pMemVk{SrcRange.pMemory, IID_DeviceMemoryVk};
            DEV_CHECK_ERR((SrcRange.pMemory != nullptr) == (pMemVk != nullptr),
                          "Failed to query IDeviceMemoryVk interface from non-null memory object");

            const auto MemRangeVk = pMemVk ? pMemVk->GetRange(SrcRange.MemoryOffset, SrcRange.MemorySize) : DeviceMemoryRangeVk{};
            DEV_CHECK_ERR((MemRangeVk.Offset % TexSparseProps.BlockSize) == 0,
                          "MemoryOffset must be a multiple of the SparseTextureProperties::BlockSize");

            if (SrcRange.MipLevel < TexSparseProps.FirstMipInTail)
            {
                const Uint32 TexWidth  = std::max(1u, TexDesc.Width >> SrcRange.MipLevel);
                const Uint32 TexHeight = std::max(1u, TexDesc.Height >> SrcRange.MipLevel);
                const Uint32 TexDepth  = std::max(1u, TexDesc.GetDepth() >> SrcRange.MipLevel);

                VkSparseImageMemoryBind& vkImgMemBind{vkImageMemoryBinds[size_t{ImageMemoryBindCount} + size_t{NumImageBindsInRange}]};
                vkImgMemBind.subresource.arrayLayer = SrcRange.ArraySlice;
                vkImgMemBind.subresource.aspectMask = aspectMask;
                vkImgMemBind.subresource.mipLevel   = SrcRange.MipLevel;
                vkImgMemBind.offset.x               = static_cast<int32_t>(SrcRange.Region.MinX);
                vkImgMemBind.offset.y               = static_cast<int32_t>(SrcRange.Region.MinY);
                vkImgMemBind.offset.z               = static_cast<int32_t>(SrcRange.Region.MinZ);
                vkImgMemBind.extent.width           = static_cast<int32_t>(std::min(SrcRange.Region.Width(), TexWidth - SrcRange.Region.MinX));
                vkImgMemBind.extent.height          = static_cast<int32_t>(std::min(SrcRange.Region.Height(), TexHeight - SrcRange.Region.MinY));
                vkImgMemBind.extent.depth           = static_cast<int32_t>(std::min(SrcRange.Region.Depth(), TexDepth - SrcRange.Region.MinZ));
                vkImgMemBind.memory                 = MemRangeVk.Handle;
                vkImgMemBind.memoryOffset           = MemRangeVk.Offset;
                vkImgMemBind.flags                  = 0;

                ++NumImageBindsInRange;
            }
            else
            {
                // Bind mip tail memory
                VkSparseImageOpaqueMemoryBindInfo& vkImgOpqBind{vkImageOpaqueBinds[ImageOpqBindCount++]};
                vkImgOpqBind.image     = pTexVk->GetVkImage();
                vkImgOpqBind.bindCount = 1;
                vkImgOpqBind.pBinds    = &vkMemoryBinds[MemoryBindCount];

                VkSparseMemoryBind& vkMemBind{vkMemoryBinds[MemoryBindCount++]};
                vkMemBind.resourceOffset = TexSparseProps.MipTailOffset + TexSparseProps.MipTailStride * SrcRange.ArraySlice + SrcRange.OffsetInMipTail;
                vkMemBind.size           = SrcRange.MemorySize; // MemRangeVk.Size may be zero if tail is unbound
                vkMemBind.memory         = MemRangeVk.Handle;
                vkMemBind.memoryOffset   = MemRangeVk.Offset;
                vkMemBind.flags          = 0;

                VERIFY(vkMemBind.size > 0, "Texture mip tail memory size must not be zero");
                VERIFY(!(TexDesc.IsArray() && (TexSparseProps.Flags & SPARSE_TEXTURE_FLAG_SINGLE_MIPTAIL) == 0) || TexSparseProps.MipTailStride != 0,
                       "For texture arrays, if SPARSE_TEXTURE_FLAG_SINGLE_MIPTAIL flag is not present, MipTailStride must not be zero");
            }
        }

        if (NumImageBindsInRange > 0)
        {
            VkSparseImageMemoryBindInfo& vkImgBind{vkImageBinds[ImageBindCount++]};
            vkImgBind.image     = pTexVk->GetVkImage();
            vkImgBind.bindCount = NumImageBindsInRange;
            vkImgBind.pBinds    = &vkImageMemoryBinds[ImageMemoryBindCount];

            ImageMemoryBindCount += NumImageBindsInRange;
        }
    }

    VERIFY_EXPR(MemoryBindCount == vkMemoryBinds.size());
    VERIFY_EXPR(ImageMemoryBindCount == vkImageMemoryBinds.size());
    VERIFY_EXPR(ImageBindCount == vkImageBinds.size());
    VERIFY_EXPR(ImageOpqBindCount == vkImageOpaqueBinds.size());

    VkBindSparseInfo BindSparse{};
    BindSparse.sType                = VK_STRUCTURE_TYPE_BIND_SPARSE_INFO;
    BindSparse.bufferBindCount      = StaticCast<uint32_t>(vkBufferBinds.size());
    BindSparse.pBufferBinds         = !vkBufferBinds.empty() ? vkBufferBinds.data() : nullptr;
    BindSparse.imageOpaqueBindCount = StaticCast<uint32_t>(vkImageOpaqueBinds.size());
    BindSparse.pImageOpaqueBinds    = !vkImageOpaqueBinds.empty() ? vkImageOpaqueBinds.data() : nullptr;
    BindSparse.imageBindCount       = StaticCast<uint32_t>(vkImageBinds.size());
    BindSparse.pImageBinds          = !vkImageBinds.empty() ? vkImageBinds.data() : nullptr;

    VERIFY_EXPR(m_VkSignalSemaphores.empty() && m_SignalSemaphoreValues.empty());
    VERIFY_EXPR(m_VkWaitSemaphores.empty() && m_WaitSemaphoreValues.empty());

    bool UsedTimelineSemaphore = false;
    for (Uint32 i = 0; i < Attribs.NumSignalFences; ++i)
    {
        FenceVkImpl* pFenceVk    = ClassPtrCast<FenceVkImpl>(Attribs.ppSignalFences[i]);
        Uint64       SignalValue = Attribs.pSignalFenceValues[i];
        if (!pFenceVk->IsTimelineSemaphore())
            continue;
        UsedTimelineSemaphore = true;
        pFenceVk->DvpSignal(SignalValue);
        m_VkSignalSemaphores.push_back(pFenceVk->GetVkSemaphore());
        m_SignalSemaphoreValues.push_back(SignalValue);
    }

    for (Uint32 i = 0; i < Attribs.NumWaitFences; ++i)
    {
        FenceVkImpl* pFenceVk  = ClassPtrCast<FenceVkImpl>(Attribs.ppWaitFences[i]);
        Uint64       WaitValue = Attribs.pWaitFenceValues[i];
        pFenceVk->DvpDeviceWait(WaitValue);

        if (pFenceVk->IsTimelineSemaphore())
        {
            UsedTimelineSemaphore = true;
            VkSemaphore WaitSem   = pFenceVk->GetVkSemaphore();
#ifdef DILIGENT_DEVELOPMENT
            for (size_t j = 0; j < m_VkWaitSemaphores.size(); ++j)
            {
                if (m_VkWaitSemaphores[j] == WaitSem)
                {
                    LOG_ERROR_MESSAGE("Fence '", pFenceVk->GetDesc().Name, "' with value (", WaitValue,
                                      ") is already added to the wait operation with value (", m_WaitSemaphoreValues[j], ")");
                }
            }
#endif
            m_VkWaitSemaphores.push_back(WaitSem);
            m_WaitSemaphoreValues.push_back(WaitValue);
        }
        else
        {
            if (VulkanUtilities::VulkanRecycledSemaphore WaitSem = pFenceVk->ExtractSignalSemaphore(GetCommandQueueId(), WaitValue))
            {
                // Here we have unique binary semaphore that must be released/recycled using release queue
                m_VkWaitSemaphores.push_back(WaitSem);
                m_WaitDstStageMasks.push_back(VK_PIPELINE_STAGE_ALL_COMMANDS_BIT);
                m_WaitRecycledSemaphores.push_back(std::move(WaitSem));
                m_WaitSemaphoreValues.push_back(0); // Ignored for binary semaphore
            }
        }
    }
    BindSparse.waitSemaphoreCount   = StaticCast<uint32_t>(m_VkWaitSemaphores.size());
    BindSparse.pWaitSemaphores      = BindSparse.waitSemaphoreCount != 0 ? m_VkWaitSemaphores.data() : nullptr;
    BindSparse.signalSemaphoreCount = StaticCast<uint32_t>(m_VkSignalSemaphores.size());
    BindSparse.pSignalSemaphores    = BindSparse.signalSemaphoreCount != 0 ? m_VkSignalSemaphores.data() : nullptr;

    VkTimelineSemaphoreSubmitInfo TimelineSemaphoreSubmitInfo{};
    if (UsedTimelineSemaphore)
    {
        BindSparse.pNext = &TimelineSemaphoreSubmitInfo;

        TimelineSemaphoreSubmitInfo.sType                     = VK_STRUCTURE_TYPE_TIMELINE_SEMAPHORE_SUBMIT_INFO;
        TimelineSemaphoreSubmitInfo.pNext                     = nullptr;
        TimelineSemaphoreSubmitInfo.waitSemaphoreValueCount   = BindSparse.waitSemaphoreCount;
        TimelineSemaphoreSubmitInfo.pWaitSemaphoreValues      = BindSparse.waitSemaphoreCount != 0 ? m_WaitSemaphoreValues.data() : nullptr;
        TimelineSemaphoreSubmitInfo.signalSemaphoreValueCount = BindSparse.signalSemaphoreCount;
        TimelineSemaphoreSubmitInfo.pSignalSemaphoreValues    = BindSparse.signalSemaphoreCount != 0 ? m_SignalSemaphoreValues.data() : nullptr;
    }

    SyncPointVkPtr pSyncPoint;
    {
        CommandQueueVkImpl* pQueueVk = ClassPtrCast<CommandQueueVkImpl>(LockCommandQueue());

        pQueueVk->BindSparse(BindSparse);
        pSyncPoint = pQueueVk->GetLastSyncPoint();

        UnlockCommandQueue();
    }

    if (!UsedTimelineSemaphore)
    {
        for (Uint32 i = 0; i < Attribs.NumSignalFences; ++i)
        {
            FenceVkImpl* pFenceVk = ClassPtrCast<FenceVkImpl>(Attribs.ppSignalFences[i]);
            if (!pFenceVk->IsTimelineSemaphore())
                pFenceVk->AddPendingSyncPoint(GetCommandQueueId(), Attribs.pSignalFenceValues[i], pSyncPoint);
        }
    }

    m_VkSignalSemaphores.clear();
    m_SignalSemaphoreValues.clear();
    m_VkWaitSemaphores.clear();
    m_WaitSemaphoreValues.clear();
}